

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleBase.hpp
# Opt level: O3

TestCaseGroup *
vkt::pipeline::
makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosCorrectness>>
          (TestContext *testCtx,string *groupName,UVec3 *imageSizes,deUint32 imageSizesElemCount,
          VkSampleCountFlagBits *imageSamples,deUint32 imageSamplesElemCount)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  VkSampleCountFlagBits VVar4;
  TestNode *this;
  ostream *poVar5;
  TestNode *this_00;
  long *plVar6;
  MultisampleCaseBase *node;
  size_type *psVar7;
  ulong uVar8;
  ImageMSParams imageMSParams;
  ostringstream imageSizeStream;
  string local_398;
  ImageMSParams local_378;
  ulong local_368;
  UVec3 *local_360;
  ulong local_358;
  ulong local_350;
  VkSampleCountFlagBits *local_348;
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_360 = imageSizes;
  local_348 = imageSamples;
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,(groupName->_M_dataplus)._M_p,"");
  if (imageSizesElemCount != 0) {
    local_368 = (ulong)imageSizesElemCount;
    local_350 = (ulong)imageSamplesElemCount;
    local_358 = 0;
    do {
      uVar1 = local_360[local_358].m_data[0];
      uVar2 = local_360[local_358].m_data[1];
      uVar3 = local_360[local_358].m_data[2];
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      this_00 = (TestNode *)operator_new(0x70);
      std::__cxx11::stringbuf::str();
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,(char *)local_320[0],"");
      if (local_320[0] != local_310) {
        operator_delete(local_320[0],local_310[0] + 1);
      }
      if (imageSamplesElemCount != 0) {
        uVar8 = 0;
        do {
          VVar4 = local_348[uVar8];
          local_378.numSamples = VVar4;
          local_378.imageSize.m_data[0] = uVar1;
          local_378.imageSize.m_data[1] = uVar2;
          local_378.imageSize.m_data[2] = uVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
          std::ostream::operator<<((ostringstream *)local_320,VVar4);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
          std::ios_base::~ios_base(local_2b0);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0xae4ca3);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_398.field_2._M_allocated_capacity = *psVar7;
            local_398.field_2._8_8_ = plVar6[3];
          }
          else {
            local_398.field_2._M_allocated_capacity = *psVar7;
            local_398._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_398._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          node = multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosCorrectness>::
                 createCase(testCtx,&local_398,&local_378);
          tcu::TestNode::addChild(this_00,(TestNode *)node);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if (local_340[0] != local_330) {
            operator_delete(local_340[0],local_330[0] + 1);
          }
          uVar8 = uVar8 + 1;
        } while (local_350 != uVar8);
      }
      tcu::TestNode::addChild(this,this_00);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      local_358 = local_358 + 1;
    } while (local_358 != local_368);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* makeMSGroup	(tcu::TestContext&							testCtx,
								 const std::string							groupName,
								 const tcu::UVec3							imageSizes[],
								 const deUint32								imageSizesElemCount,
								 const vk::VkSampleCountFlagBits			imageSamples[],
								 const deUint32								imageSamplesElemCount)
{
	de::MovePtr<tcu::TestCaseGroup> caseGroup(new tcu::TestCaseGroup(testCtx, groupName.c_str(), ""));

	for (deUint32 imageSizeNdx = 0u; imageSizeNdx < imageSizesElemCount; ++imageSizeNdx)
	{
		const tcu::UVec3	imageSize = imageSizes[imageSizeNdx];
		std::ostringstream	imageSizeStream;

		imageSizeStream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

		de::MovePtr<tcu::TestCaseGroup> sizeGroup(new tcu::TestCaseGroup(testCtx, imageSizeStream.str().c_str(), ""));

		for (deUint32 imageSamplesNdx = 0u; imageSamplesNdx < imageSamplesElemCount; ++imageSamplesNdx)
		{
			const vk::VkSampleCountFlagBits		samples = imageSamples[imageSamplesNdx];
			const multisample::ImageMSParams	imageMSParams = multisample::ImageMSParams(samples, imageSize);

			sizeGroup->addChild(CaseClass::createCase(testCtx, "samples_" + de::toString(samples), imageMSParams));
		}

		caseGroup->addChild(sizeGroup.release());
	}
	return caseGroup.release();
}